

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O3

self_ * __thiscall
standards::exp_number<float>::operator+=(exp_number<float> *this,exp_number<float> *rhs)

{
  float fVar1;
  float fVar2;
  float local_c;
  
  if (this->sign_ == -1) {
    if (rhs->sign_ != -1) {
      if (rhs->sign_ != 1) {
        return this;
      }
      local_c = this->log_;
      fVar1 = rhs->log_;
      if (local_c <= fVar1) {
        if (local_c < fVar1) {
          fVar2 = expf(local_c - fVar1);
          fVar2 = logf(1.0 - fVar2);
          this->log_ = fVar2 + fVar1;
          this->sign_ = 1;
          return this;
        }
        goto LAB_00105d1c;
      }
      goto LAB_00105ca8;
    }
  }
  else {
    if (this->sign_ != 1) {
      this->log_ = rhs->log_;
      this->sign_ = rhs->sign_;
      return this;
    }
    if (rhs->sign_ == -1) {
      local_c = this->log_;
      fVar1 = rhs->log_;
      if (local_c <= fVar1) {
        if (local_c < fVar1) {
          fVar2 = expf(local_c - fVar1);
          fVar2 = logf(1.0 - fVar2);
          this->log_ = fVar2 + fVar1;
          this->sign_ = -1;
          return this;
        }
LAB_00105d1c:
        this->sign_ = 0;
        return this;
      }
LAB_00105ca8:
      fVar1 = expf(fVar1 - local_c);
      fVar1 = 1.0 - fVar1;
      goto LAB_00105cc9;
    }
    if (rhs->sign_ != 1) {
      return this;
    }
  }
  fVar1 = this->log_;
  fVar2 = rhs->log_;
  local_c = fVar2;
  if (fVar2 <= fVar1) {
    local_c = fVar1;
  }
  fVar1 = expf((float)((uint)(fVar1 - fVar2) | (uint)DAT_00109030));
  fVar1 = fVar1 + 1.0;
LAB_00105cc9:
  fVar1 = logf(fVar1);
  this->log_ = fVar1 + local_c;
  return this;
}

Assistant:

self_& operator+=(exp_number<U> const& rhs) {
    if (sign_ == is_positive) {
      if (rhs.sign_ == is_positive) {
        // pos + pos
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
      } else if (rhs.sign_ == is_negative) {
        if (log_ > rhs.log_) {
          // pos + neg = pos
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // pos + neg = neg
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_negative;
        } else {
          // pos + neg = zero
          sign_ = is_zero;
        }
      }
    } else if (sign_ == is_negative) {
      if (rhs.sign_ == is_positive) {
        if (log_ > rhs.log_) {
          // neg + pos = neg
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // neg + pos = pos
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_positive;
        } else {
          // neg + pos = zero
          sign_ = is_zero;
        }
      } else if (rhs.sign_ == is_negative)
        // neg + neg
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
    } else {
      log_ = rhs.log_;
      sign_ = rhs.sign_;
    }
    return *this;
  }